

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiPopupData *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  undefined7 in_register_00000031;
  ImGuiWindow *pIVar4;
  
  pIVar3 = GImGui;
  pIVar1 = (GImGui->OpenPopupStack).Data;
  pIVar4 = pIVar1[remaining].Window;
  pIVar2 = pIVar1[remaining].SourceWindow;
  ImVector<ImGuiPopupData>::resize(&GImGui->OpenPopupStack,remaining);
  if ((int)CONCAT71(in_register_00000031,restore_focus_to_window_under_popup) == 0) {
    return;
  }
  if (pIVar2 == (ImGuiWindow *)0x0) {
    pIVar4 = (ImGuiWindow *)0x0;
  }
  else {
    if (pIVar4 != (ImGuiWindow *)0x0 && pIVar2->WasActive == false) {
      FocusTopMostWindowUnderOne(pIVar4,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar3->NavLayer != ImGuiNavLayer_Main) ||
        (pIVar4 = pIVar2->NavLastChildNavWindow, pIVar4 == (ImGuiWindow *)0x0)) ||
       (pIVar4->WasActive == false)) {
      pIVar4 = pIVar2;
    }
  }
  FocusWindow(pIVar4);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}